

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O1

int init_config_path(AP_CTX *ctx)

{
  char *__s;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *dst;
  
  if (ctx->config_path != (char *)0x0) {
    bVar1 = false;
    iVar2 = 0;
    goto LAB_00103251;
  }
  if (ctx->default_dir == (char *)0x0) {
    iVar2 = get_default_directory(ctx);
    if (iVar2 == 0) {
      iVar2 = create_directory(ctx->default_dir);
      if (iVar2 == 0) goto LAB_001031b5;
    }
    bVar1 = false;
  }
  else {
LAB_001031b5:
    __s = ctx->default_dir;
    sVar3 = strlen(__s);
    sVar3 = sVar3 + 0x12;
    dst = (char *)calloc(1,sVar3);
    ctx->config_path = dst;
    if (dst == (char *)0x0) {
      ap_log(AP_LOG_LEVEL_ERROR,"(%s) Can not allocate memory for \'ctx->config_path\'\n",
             ctx->client_ip);
      bVar1 = true;
      iVar2 = 4;
    }
    else {
      ap_str_strlcpy(dst,__s,sVar3);
      ap_str_strlcat(ctx->config_path,"/",sVar3);
      ap_str_strlcat(ctx->config_path,"authprogs.conf",sVar3);
      bVar1 = true;
      iVar2 = 0;
    }
  }
LAB_00103251:
  if ((bVar1 && iVar2 != 0) && (ctx->config_path != (char *)0x0)) {
    free(ctx->config_path);
  }
  return iVar2;
}

Assistant:

static int init_config_path (AP_CTX *ctx)
{
	int				rc								= AP_NO_ERROR;
	size_t			size;
	BOOL			allocated_in_this_function		= FALSE;
	
	if (ctx->config_path == NULL)
	{
		if (ctx->default_dir == NULL)
		{
			rc = get_default_directory (ctx);
			if (rc != AP_NO_ERROR)
			{
				goto finish;
			}

			rc = create_directory (ctx->default_dir);
			if (rc != AP_NO_ERROR)
			{
				goto finish;
			}
		}

		allocated_in_this_function = TRUE;

		size = strlen (ctx->default_dir) + sizeof ("/") + sizeof (AP_DEFAULT_CONFIG_FILENAME) + 1;

		ctx->config_path = (char *) calloc (1, size);
		if (ctx->config_path == NULL)
		{
			ap_error ("(%s) Can not allocate memory for 'ctx->config_path'\n", ctx->client_ip);
			rc = AP_ERROR_NO_MEMORY;

			goto finish;
		}

		ap_str_strlcpy (ctx->config_path, ctx->default_dir, size);
		ap_str_strlcat (ctx->config_path, "/", size);
		ap_str_strlcat (ctx->config_path, AP_DEFAULT_CONFIG_FILENAME, size);
	}

finish:
	if (rc != AP_NO_ERROR)
	{
		if (allocated_in_this_function == TRUE)
		{
			if (ctx->config_path != NULL)
			{
				free (ctx->config_path);
			}
		}
	}

	return rc;
}